

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_advanced.hpp
# Opt level: O0

void __thiscall
LDPC4QKD::
FixedSizeEncoderQC<unsigned_char,_64UL,_128UL,_32UL,_480UL,_unsigned_short,_unsigned_char,_unsigned_char>
::encode_qc(FixedSizeEncoderQC<unsigned_char,_64UL,_128UL,_32UL,_480UL,_unsigned_short,_unsigned_char,_unsigned_char>
            *this,span<const_unsigned_char,_4096UL> in,span<unsigned_char,_2048UL> out)

{
  byte bVar1;
  uchar lhs;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  byte *pbVar5;
  reference peVar6;
  reference peVar7;
  unsigned_long outIdx;
  value_type_conflict4 QCrow;
  ulong uStack_38;
  value_type_conflict4 shiftVal;
  size_t j;
  unsigned_long QCcol;
  size_t col;
  FixedSizeEncoderQC<unsigned_char,_64UL,_128UL,_32UL,_480UL,_unsigned_short,_unsigned_char,_unsigned_char>
  *this_local;
  span<unsigned_char,_2048UL> out_local;
  span<const_unsigned_char,_4096UL> in_local;
  
  QCcol = 0;
  this_local = (FixedSizeEncoderQC<unsigned_char,_64UL,_128UL,_32UL,_480UL,_unsigned_short,_unsigned_char,_unsigned_char>
                *)out._M_ptr;
  out_local._M_ptr = in._M_ptr;
  while( true ) {
    sVar3 = std::span<const_unsigned_char,_4096UL>::size
                      ((span<const_unsigned_char,_4096UL> *)&out_local);
    if (sVar3 <= QCcol) break;
    pvVar4 = std::array<unsigned_short,_129UL>::operator[](&this->colptr,QCcol >> 5);
    uStack_38 = (ulong)*pvVar4;
    while( true ) {
      pvVar4 = std::array<unsigned_short,_129UL>::operator[](&this->colptr,(QCcol >> 5) + 1);
      if (*pvVar4 <= uStack_38) break;
      pbVar5 = std::array<unsigned_char,_480UL>::operator[](&this->values,uStack_38);
      bVar1 = *pbVar5;
      pbVar5 = std::array<unsigned_char,_480UL>::operator[](&this->row_idx,uStack_38);
      sVar3 = (ulong)*pbVar5 * 0x20 + (QCcol - bVar1 & 0x1f);
      peVar6 = std::span<unsigned_char,_2048UL>::operator[]
                         ((span<unsigned_char,_2048UL> *)&this_local,sVar3);
      lhs = *peVar6;
      peVar7 = std::span<const_unsigned_char,_4096UL>::operator[]
                         ((span<const_unsigned_char,_4096UL> *)&out_local,QCcol);
      bVar2 = xor_as_bools<unsigned_char,unsigned_char>(lhs,*peVar7);
      peVar6 = std::span<unsigned_char,_2048UL>::operator[]
                         ((span<unsigned_char,_2048UL> *)&this_local,sVar3);
      *peVar6 = bVar2;
      uStack_38 = uStack_38 + 1;
    }
    QCcol = QCcol + 1;
  }
  return;
}

Assistant:

void encode_qc(
                std::span<bit_type const, N * expansion_factor> in,
                std::span<bit_type, M * expansion_factor> out) const {

            static_assert(N >= M, "The syndrome should be shorter than the input bitstring.");

            for (std::size_t col = 0; col < in.size(); col++) {
                auto QCcol = col / expansion_factor;  // column index into matrix of exponents
                for (std::size_t j = colptr[QCcol]; j < colptr[QCcol + 1]; j++) {
                    auto shiftVal = values[j];
                    auto QCrow = row_idx[j];  // row index into matrix of exponents
                    // computes `outIdx`, which is the unique row index (into full matrix) at which there is a `1`
                    // arising from the current sub-block.
                    // The sub-block is determined by the QC-exponent `shiftVal`.
                    // Add the base row-index of the current sub-block to the shift
                    auto outIdx = (expansion_factor * QCrow) + ((col - shiftVal) % expansion_factor);

                    out[outIdx] = xor_as_bools(out[outIdx], in[col]);
                }
            }
        }